

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this,ByteData *seed)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_49;
  string local_48;
  ByteData *local_18;
  ByteData *seed_local;
  HDWallet *this_local;
  
  local_18 = seed;
  seed_local = &this->seed_;
  ByteData::ByteData(&this->seed_,seed);
  sVar1 = ByteData::GetDataSize(local_18);
  if (sVar1 != 0x10) {
    sVar1 = ByteData::GetDataSize(local_18);
    if (sVar1 != 0x20) {
      sVar1 = ByteData::GetDataSize(local_18);
      if (sVar1 != 0x40) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_48,"Seed length error.",&local_49);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(const ByteData& seed) : seed_(seed) {
  if ((seed.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}